

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::insert
          (MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *this,
          GlobalHandle *searchValue,
          unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *ptr)

{
  undefined8 uVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false,_false>,_bool>
  pVar2;
  optional<unsigned_long> oVar3;
  size_type index;
  _Storage<unsigned_long,_true> local_30;
  
  local_30 = (_Storage<unsigned_long,_true>)
             std::
             _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->lookup)._M_h,searchValue);
  if ((__node_type *)local_30._M_value == (__node_type *)0x0) {
    local_30._M_value =
         (long)(this->dataStorage).
               super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->dataStorage).
               super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    std::
    vector<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>,std::allocator<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>>>
    ::
    emplace_back<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>>
              ((vector<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>,std::allocator<std::unique_ptr<helics::TranslatorInfo,std::default_delete<helics::TranslatorInfo>>>>
                *)this,ptr);
    pVar2 = std::
            _Hashtable<helics::GlobalHandle,std::pair<helics::GlobalHandle_const,unsigned_long>,std::allocator<std::pair<helics::GlobalHandle_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalHandle>,std::hash<helics::GlobalHandle>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<helics::GlobalHandle_const&,unsigned_long&>
                      ((_Hashtable<helics::GlobalHandle,std::pair<helics::GlobalHandle_const,unsigned_long>,std::allocator<std::pair<helics::GlobalHandle_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalHandle>,std::hash<helics::GlobalHandle>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->lookup,searchValue,&local_30);
    uVar1 = CONCAT71(pVar2._9_7_,1);
  }
  else {
    uVar1 = 0;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_30._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t>
        insert(const searchType& searchValue, std::unique_ptr<VType>&& ptr)
    {
        auto fnd = lookup.find(searchValue);
        if (fnd != lookup.end()) {
            return std::nullopt;
        }
        auto index = dataStorage.size();
        dataStorage.emplace_back(std::move(ptr));
        lookup.emplace(searchValue, index);
        return index;
    }